

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

void Abc_TgCreateGroups(Abc_TgMan_t *pMan)

{
  ulong *puVar1;
  uint nVars;
  word *pTruth;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong *puVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong *puVar17;
  int pStore [17];
  int local_78 [18];
  
  nVars = pMan->nVars;
  lVar16 = (long)(int)nVars;
  bVar4 = (byte)nVars;
  uVar3 = 1 << (bVar4 - 6 & 0x1f);
  if (lVar16 < 7) {
    uVar3 = 1;
  }
  if (0x10 < lVar16) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                  ,0x71a,"void Abc_TgCreateGroups(Abc_TgMan_t *)");
  }
  pTruth = pMan->pTruth;
  if ((int)nVars < 6) {
    uVar5 = 1L << (bVar4 & 0x3f);
    uVar9 = ~(-1L << ((byte)uVar5 & 0x3f)) & *pTruth;
    uVar7 = uVar5;
    uVar11 = uVar9;
    if (nVars < 6) {
      do {
        uVar11 = uVar11 | uVar9 << ((byte)uVar7 & 0x3f);
        uVar7 = uVar7 + uVar5;
      } while (uVar7 < 0x40);
    }
    if (*pTruth != uVar11) {
      __assert_fail("*pTruth == nTruth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
    }
  }
  uVar7 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    iVar15 = 0;
  }
  else {
    uVar11 = 0;
    iVar15 = 0;
    do {
      uVar5 = pTruth[uVar11];
      if (uVar5 != 0) {
        uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
        uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
        uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
        uVar5 = (uVar5 >> 8) + uVar5;
        lVar12 = (uVar5 >> 0x10) + uVar5;
        iVar15 = iVar15 + ((int)((ulong)lVar12 >> 0x20) + (int)lVar12 & 0xffU);
      }
      uVar11 = uVar11 + 1;
    } while (uVar7 != uVar11);
  }
  if (iVar15 != uVar3 * 0x20 && SBORROW4(iVar15,uVar3 * 0x20) == (int)(iVar15 + uVar3 * -0x20) < 0)
  {
    if (0 < (int)uVar3) {
      uVar11 = 0;
      do {
        pTruth[uVar11] = ~pTruth[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
    }
    iVar15 = uVar3 * 0x40 - iVar15;
    pMan->uPhase = pMan->uPhase | 1 << (bVar4 & 0x1f);
  }
  Abc_TtCountOnesInCofs(pTruth,nVars,local_78);
  local_78[lVar16] = iVar15;
  if (0 < (int)nVars) {
    uVar11 = 0;
    do {
      iVar10 = iVar15 - local_78[uVar11];
      if (local_78[uVar11] < iVar10) {
        puVar13 = pMan->pTruth;
        bVar4 = (byte)uVar11;
        if (uVar3 == 1) {
          bVar6 = (byte)(1 << (bVar4 & 0x1f));
          *puVar13 = (s_Truths6[uVar11] & *puVar13) >> (bVar6 & 0x3f) |
                     *puVar13 << (bVar6 & 0x3f) & s_Truths6[uVar11];
        }
        else if (uVar11 < 6) {
          if (0 < (int)uVar3) {
            uVar5 = s_Truths6[uVar11];
            uVar9 = 0;
            do {
              bVar6 = (byte)(1 << (bVar4 & 0x1f));
              puVar13[uVar9] =
                   (puVar13[uVar9] & uVar5) >> (bVar6 & 0x3f) |
                   puVar13[uVar9] << (bVar6 & 0x3f) & uVar5;
              uVar9 = uVar9 + 1;
            } while (uVar7 != uVar9);
          }
        }
        else if (0 < (int)uVar3) {
          puVar1 = puVar13 + (int)uVar3;
          bVar6 = (byte)(uVar11 - 6);
          uVar8 = 1 << (bVar6 & 0x1f);
          iVar14 = 2 << (bVar6 & 0x1f);
          uVar5 = 1;
          if (1 < (int)uVar8) {
            uVar5 = (ulong)uVar8;
          }
          puVar17 = puVar13 + (int)uVar8;
          do {
            if (uVar11 - 6 != 0x1f) {
              uVar9 = 0;
              do {
                uVar2 = puVar13[uVar9];
                puVar13[uVar9] = puVar17[uVar9];
                puVar17[uVar9] = uVar2;
                uVar9 = uVar9 + 1;
              } while (uVar5 != uVar9);
            }
            puVar13 = puVar13 + iVar14;
            puVar17 = puVar17 + iVar14;
          } while (puVar13 < puVar1);
        }
        pMan->uPhase = pMan->uPhase | 1 << (bVar4 & 0x1f);
        local_78[uVar11] = iVar10;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != nVars);
  }
  Abc_TgSplitGroup(pMan,pMan->pGroup,local_78);
  pMan->fPhased = (uint)(local_78[0] * 2 != iVar15);
  return;
}

Assistant:

static void Abc_TgCreateGroups(Abc_TgMan_t * pMan)
{
    int pStore[17];
    int i, nOnes;
    int nVars = pMan->nVars, nWords = Abc_TtWordNum(nVars);
    //TiedGroup * pGrp = pMan->pGroup;
    assert(nVars <= 16);
    // normalize polarity    
    nOnes = Abc_TtCountOnesInTruth(pMan->pTruth, nVars);
    if (nOnes > nWords * 32)
    {
        Abc_TtNot(pMan->pTruth, nWords);
        nOnes = nWords * 64 - nOnes;
        pMan->uPhase |= (1 << nVars);
    }
    // normalize phase
    Abc_TtCountOnesInCofs(pMan->pTruth, nVars, pStore);
    pStore[nVars] = nOnes;
    for (i = 0; i < nVars; i++)
    {
        if (pStore[i] >= nOnes - pStore[i])
            continue;
        Abc_TtFlip(pMan->pTruth, nWords, i);
        pMan->uPhase |= (1 << i);
        pStore[i] = nOnes - pStore[i];
    }

    Abc_TgSplitGroup(pMan, pMan->pGroup, pStore);
    pMan->fPhased = pStore[0] * 2 != nOnes;
}